

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
AddressFixture_AddressMaxOffsetPlus1_Test::TestBody(AddressFixture_AddressMaxOffsetPlus1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_b0;
  Message local_a8;
  offset_type local_a0;
  uint local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  Message local_80;
  segment_type local_76;
  uint local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  address expected;
  address local_20;
  address actual;
  address addr;
  AddressFixture_AddressMaxOffsetPlus1_Test *this_local;
  
  actual.a_ = 0x3fffff;
  local_20 = pstore::operator+((address)0x3fffff,1);
  pstore::address::address((address *)&gtest_ar.message_,1,0);
  testing::internal::EqHelper::Compare<pstore::address,_pstore::address,_nullptr>
            ((EqHelper *)local_40,"expected","actual",(address *)&gtest_ar.message_,&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_74 = 1;
  local_76 = pstore::address::segment(&local_20);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_short,_nullptr>
            ((EqHelper *)local_70,"1U","actual.segment ()",&local_74,&local_76);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_9c = 0;
  local_a0 = pstore::address::offset(&local_20);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_98,"0U","actual.offset ()",&local_9c,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  return;
}

Assistant:

TEST_F (AddressFixture, AddressMaxOffsetPlus1) {
    constexpr auto addr = pstore::address{pstore::address::max_offset};
    pstore::address const actual = addr + 1;
    auto const expected = pstore::address{1, 0};
    EXPECT_EQ (expected, actual);
    EXPECT_EQ (1U, actual.segment ());
    EXPECT_EQ (0U, actual.offset ());
}